

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void ResetButtonStates(void)

{
  FButtonStatus *this;
  FButtonStatus *button;
  int i;
  
  for (button._4_4_ = 0x1f; -1 < button._4_4_; button._4_4_ = button._4_4_ + -1) {
    this = ActionMaps[button._4_4_].Button;
    if ((this != &Button_Mlook) && (this != &Button_Klook)) {
      FButtonStatus::ReleaseKey(this,0);
    }
    FButtonStatus::ResetTriggers(this);
  }
  return;
}

Assistant:

void ResetButtonStates ()
{
	for (int i = NUM_ACTIONS-1; i >= 0; --i)
	{
		FButtonStatus *button = ActionMaps[i].Button;

		if (button != &Button_Mlook && button != &Button_Klook)
		{
			button->ReleaseKey (0);
		}
		button->ResetTriggers ();
	}
}